

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  int y;
  int x;
  char local_2a [2];
  int local_28;
  int local_24;
  
  print_foo();
  print(99);
  local_24 = 7;
  local_28 = 9;
  swap_v(9,7);
  swap_r(&local_24,&local_28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x: ",3);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", y: ",5);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28);
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2a,1);
  swap_v(9,7);
  swap_v(9,7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cx: ",4);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", cy: ",6);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,9);
  local_2a[1] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2a + 1,1);
  swap_v(9,7);
  swap_v(9,7);
  return 0;
}

Assistant:

int main()
{
	print_foo();
	print(99);

	int x = 7;
	int y = 9;
	// arguments passed by value, there is no need to check with cout
	// because we won't see the changes
	swap_v(x, y);
	swap_r(x, y);
	std::cout << "x: " << x << ", y: " << y << '\n';

	// arguments passed by value, there is no need to check with cout
	// because we won't see the changes
	swap_v(7, 9);
	// won't compile, because 7 and 9 are rvalues
	//swap_r(7, 9);

	const int cx = 7;
	const int cy = 9;
	swap_v(cx, cy);
	std::cout << "cx: " << cx << ", cy: " << cy << '\n';
	// won't compile, because cx and cy are constant lvalues
	//swap_r(cx, cy);

	// arguments passed by value, there is no need to check with cout
	// because we won't see the changes
	swap_v(7.7, 9.9);
	// won't compile, because 7.7 and 9.9 are rvalues
	//swap_r(7.7, 9.9);

	double dx = 7.7;
	double dy = 9.9;
	// arguments passed by value, there is no need to check with cout
	// because we won't see the changes
	swap_v(dx, dy);
	// won't compile because swap_r expects int&
	//swap_r(dx, dy);
	
	return 0;
}